

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssp_blas2.c
# Opt level: O1

int sp_sgemv(char *trans,float alpha,SuperMatrix *A,float *x,int incx,float beta,float *y,int incy)

{
  byte bVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  int_t *piVar6;
  ulong uVar7;
  undefined8 uVar8;
  float *pfVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  int info;
  char msg [256];
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  float local_144;
  ulong local_140;
  char local_138 [264];
  
  bVar1 = *trans;
  pvVar3 = A->Store;
  lVar4 = *(long *)((long)pvVar3 + 8);
  local_154 = 0;
  if ((bVar1 - 0x43 < 0x2c) && ((0x80000020801U >> ((ulong)(bVar1 - 0x43) & 0x3f) & 1) != 0)) {
    if ((A->nrow < 0) || (A->ncol < 0)) {
      local_154 = 3;
    }
    else if (incx == 0) {
      local_154 = 5;
    }
    else if (incy == 0) {
      local_154 = 8;
    }
  }
  else {
    local_154 = 1;
  }
  if (local_154 == 0) {
    if (((A->nrow != 0) && (uVar14 = (ulong)(uint)A->ncol, uVar14 != 0)) &&
       ((alpha != 0.0 || (((NAN(alpha) || (beta != 1.0)) || (NAN(beta))))))) {
      piVar6 = &A->ncol;
      if (bVar1 == 0x4e) {
        piVar6 = &A->nrow;
      }
      uVar5 = *piVar6;
      uVar7 = (ulong)uVar5;
      if (incx < 1) {
        piVar6 = &A->nrow;
        if (bVar1 == 0x4e) {
          piVar6 = &A->ncol;
        }
        lVar15 = (long)incx * (1 - (long)*piVar6);
      }
      else {
        lVar15 = 0;
      }
      iVar13 = (1 - uVar5) * incy;
      if (0 < incy) {
        iVar13 = 0;
      }
      if ((beta != 1.0) || (NAN(beta))) {
        if (incy == 1) {
          if ((beta != 0.0) || (NAN(beta))) {
            if (0 < (int)uVar5) {
              uVar10 = 0;
              do {
                y[uVar10] = y[uVar10] * beta;
                uVar10 = uVar10 + 1;
              } while (uVar7 != uVar10);
            }
          }
          else if (0 < (int)uVar5) {
            local_150 = iVar13;
            local_14c = incx;
            local_148 = incy;
            local_144 = alpha;
            local_140 = uVar14;
            memset(y,0,uVar7 * 4);
            uVar14 = local_140;
            alpha = local_144;
            incx = local_14c;
            iVar13 = local_150;
            incy = local_148;
          }
        }
        else if ((beta != 0.0) || (NAN(beta))) {
          if (0 < (int)uVar5) {
            pfVar9 = y + iVar13;
            do {
              *pfVar9 = *pfVar9 * beta;
              pfVar9 = pfVar9 + incy;
              uVar5 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar5;
            } while (uVar5 != 0);
          }
        }
        else if (0 < (int)uVar5) {
          pfVar9 = y + iVar13;
          do {
            *pfVar9 = 0.0;
            pfVar9 = pfVar9 + incy;
            uVar5 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
      }
      if ((alpha != 0.0) || (NAN(alpha))) {
        if ((bVar1 | 0x20) == 0x6e) {
          if (incy == 1) {
            if ((int)uVar14 < 1) {
              return 0;
            }
            uVar7 = 0;
            do {
              fVar16 = x[lVar15];
              if ((fVar16 != 0.0) || (NAN(fVar16))) {
                iVar13 = *(int *)(*(long *)((long)pvVar3 + 0x18) + uVar7 * 4);
                lVar11 = (long)iVar13;
                iVar2 = *(int *)(*(long *)((long)pvVar3 + 0x18) + 4 + uVar7 * 4);
                if (iVar13 < iVar2) {
                  lVar12 = *(long *)((long)pvVar3 + 0x10);
                  do {
                    iVar13 = *(int *)(lVar12 + lVar11 * 4);
                    y[iVar13] = *(float *)(lVar4 + lVar11 * 4) * fVar16 * alpha + y[iVar13];
                    lVar11 = lVar11 + 1;
                  } while (iVar2 != lVar11);
                }
              }
              lVar15 = lVar15 + incx;
              uVar7 = uVar7 + 1;
            } while (uVar7 != uVar14);
            return 0;
          }
          uVar8 = 0x1ce;
        }
        else {
          if (incx == 1) {
            if ((int)uVar14 < 1) {
              return 0;
            }
            lVar15 = *(long *)((long)pvVar3 + 0x18);
            lVar11 = (long)iVar13;
            uVar7 = 0;
            do {
              iVar13 = *(int *)(lVar15 + uVar7 * 4);
              lVar12 = (long)iVar13;
              iVar2 = *(int *)(lVar15 + 4 + uVar7 * 4);
              fVar16 = 0.0;
              if (iVar13 < iVar2) {
                do {
                  fVar16 = fVar16 + *(float *)(lVar4 + lVar12 * 4) *
                                    x[*(int *)(*(long *)((long)pvVar3 + 0x10) + lVar12 * 4)];
                  lVar12 = lVar12 + 1;
                } while (iVar2 != lVar12);
              }
              uVar7 = uVar7 + 1;
              y[lVar11] = fVar16 * alpha + y[lVar11];
              lVar11 = lVar11 + incy;
            } while (uVar7 != uVar14);
            return 0;
          }
          uVar8 = 0x1de;
        }
        sprintf(local_138,"%s at line %d in file %s\n","Not implemented.",uVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ssp_blas2.c"
               );
        superlu_abort_and_exit(local_138);
      }
    }
  }
  else {
    input_error("sp_sgemv ",&local_154);
  }
  return 0;
}

Assistant:

int
sp_sgemv(char *trans, float alpha, SuperMatrix *A, float *x, 
	 int incx, float beta, float *y, int incy)
{
    /* Local variables */
    NCformat *Astore;
    float   *Aval;
    int info;
    float temp;
    int lenx, leny;
    int iy, jx, jy, kx, ky, irow;
    int_t i, j;
    int notran;

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0 )
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_sgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if (A->nrow == 0 || A->ncol == 0 || (alpha == 0. && beta == 1.))
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if (strncmp(trans, "N", 1)==0) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if (beta != 1.) {
	if (incy == 1) {
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) y[i] = 0.;
	    else
		for (i = 0; i < leny; ++i) y[i] = beta * y[i];
	} else {
	    iy = ky;
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) {
		    y[iy] = 0.;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    y[iy] = beta * y[iy];
		    iy += incy;
		}
	}
    }
    
    if (alpha == 0.) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if (x[jx] != 0.) {
		    temp = alpha * x[jx];
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			y[irow] += temp * Aval[i];
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp += Aval[i] * x[irow];
		}
		y[jy] += alpha * temp;
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;
}